

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O3

void Imath_3_2::extractEuler<float>(Matrix33<float> *mat,float *rot)

{
  undefined8 uVar1;
  ulong uVar2;
  float __x;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  uVar1 = *(undefined8 *)mat->x[0];
  uVar2 = *(ulong *)mat->x[1];
  __x = (float)uVar1;
  fVar5 = (float)((ulong)uVar1 >> 0x20);
  fVar6 = __x * __x + fVar5 * fVar5;
  if (fVar6 < 2.3509887e-38) {
    fVar4 = ABS(__x);
    fVar5 = ABS(fVar5);
    fVar6 = fVar5;
    if (fVar5 <= fVar4) {
      fVar6 = fVar4;
    }
    if ((fVar6 != 0.0) || (NAN(fVar6))) {
      fVar6 = SQRT((fVar4 / fVar6) * (fVar4 / fVar6) + (fVar5 / fVar6) * (fVar5 / fVar6)) * fVar6;
      goto LAB_00104f2e;
    }
  }
  else {
    fVar6 = SQRT(fVar6);
LAB_00104f2e:
    if ((fVar6 != 0.0) || (NAN(fVar6))) {
      __x = __x / fVar6;
    }
  }
  fVar5 = (float)uVar2;
  fVar4 = (float)(uVar2 >> 0x20);
  fVar6 = fVar5 * fVar5 + fVar4 * fVar4;
  if (fVar6 < 2.3509887e-38) {
    fVar3 = ABS(fVar5);
    fVar4 = ABS(fVar4);
    fVar6 = fVar4;
    if (fVar4 <= fVar3) {
      fVar6 = fVar3;
    }
    if ((fVar6 == 0.0) && (!NAN(fVar6))) goto LAB_00104f68;
    fVar6 = SQRT((fVar3 / fVar6) * (fVar3 / fVar6) + (fVar4 / fVar6) * (fVar4 / fVar6)) * fVar6;
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    uVar2 = (ulong)(uint)(fVar5 / fVar6);
  }
LAB_00104f68:
  fVar6 = atan2f((float)uVar2,__x);
  *rot = -fVar6;
  return;
}

Assistant:

void
extractEuler (const Matrix33<T>& mat, T& rot)
{
    //
    // Normalize the local x and y axes to remove scaling.
    //

    Vec2<T> i (mat[0][0], mat[0][1]);
    Vec2<T> j (mat[1][0], mat[1][1]);

    i.normalize ();
    j.normalize ();

    //
    // Extract the angle, rot.
    //

    rot = -std::atan2 (j[0], i[0]);
}